

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_cc_fv_res(REF_GRID ref_grid,REF_INT nequ,REF_DBL *flux,REF_DBL *res)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  REF_STATUS RVar1;
  uint uVar2;
  int iVar3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *xyzs [4];
  REF_DBL tet_flux [4];
  REF_DBL flux_grad [3];
  REF_DBL cell_vol;
  REF_INT nodes [27];
  int local_50;
  int local_4c;
  REF_INT cell_node;
  REF_INT cell;
  REF_INT dir;
  REF_INT equ;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *res_local;
  REF_DBL *flux_local;
  REF_INT nequ_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[8];
  local_4c = 0;
  do {
    if (ref_cell_00->max <= local_4c) {
      ref_grid_local._4_4_ = ref_node_ghost_dbl(ref_node_00,res,nequ);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x211,"ref_phys_cc_fv_res",(ulong)ref_grid_local._4_4_,"ghost res");
      }
      return ref_grid_local._4_4_;
    }
    RVar1 = ref_cell_nodes(ref_cell_00,local_4c,(REF_INT *)&cell_vol);
    if (RVar1 == 0) {
      for (local_50 = 0; local_50 < ref_cell_00->node_per; local_50 = local_50 + 1) {
        *(REF_DBL **)(&ref_private_macro_code_rss_1 + (long)local_50 * 2) =
             ref_node_00->real + nodes[(long)local_50 + -2] * 0xf;
      }
      uVar2 = ref_node_xyz_vol((REF_DBL **)&ref_private_macro_code_rss_1,flux_grad + 2);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x201,"ref_phys_cc_fv_res",(ulong)uVar2,"vol");
        return uVar2;
      }
      for (cell_node = 0; cell_node < 3; cell_node = cell_node + 1) {
        for (cell = 0; cell < nequ; cell = cell + 1) {
          for (local_50 = 0; local_50 < ref_cell_00->node_per; local_50 = local_50 + 1) {
            xyzs[(long)local_50 + 3] =
                 (REF_DBL *)flux[cell + cell_node * nequ + nequ * 3 * nodes[(long)local_50 + -2]];
          }
          uVar2 = ref_node_xyz_grad((REF_DBL **)&ref_private_macro_code_rss_1,(REF_DBL *)(xyzs + 3),
                                    tet_flux + 3);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x208,"ref_phys_cc_fv_res",(ulong)uVar2,"grad");
            return uVar2;
          }
          for (local_50 = 0; local_50 < ref_cell_00->node_per; local_50 = local_50 + 1) {
            iVar3 = cell + nequ * nodes[(long)local_50 + -2];
            res[iVar3] = tet_flux[(long)cell_node + 3] * 0.25 * flux_grad[2] + res[iVar3];
          }
        }
      }
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_phys_cc_fv_res(REF_GRID ref_grid, REF_INT nequ,
                                      REF_DBL *flux, REF_DBL *res) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT equ, dir, cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL cell_vol, flux_grad[3];
  REF_DBL tet_flux[4], *xyzs[4];

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    each_ref_cell_cell_node(ref_cell, cell_node) {
      xyzs[cell_node] = ref_node_xyz_ptr(ref_node, nodes[cell_node]);
    }
    RSS(ref_node_xyz_vol(xyzs, &cell_vol), "vol");
    for (dir = 0; dir < 3; dir++) {
      for (equ = 0; equ < nequ; equ++) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          tet_flux[cell_node] =
              flux[equ + dir * nequ + 3 * nequ * nodes[cell_node]];
        }
        RSS(ref_node_xyz_grad(xyzs, tet_flux, flux_grad), "grad");
        each_ref_cell_cell_node(ref_cell, cell_node) {
          res[equ + nequ * nodes[cell_node]] +=
              0.25 * flux_grad[dir] * cell_vol;
        }
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, res, nequ), "ghost res");

  return REF_SUCCESS;
}